

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O0

void __thiscall
JsrtExternalObject::JsrtExternalObject
          (JsrtExternalObject *this,JsrtExternalType *type,void *data,uint inlineSlotSize)

{
  void *dst;
  uint inlineSlotSize_local;
  void *data_local;
  JsrtExternalType *type_local;
  JsrtExternalObject *this_local;
  
  Js::DynamicObject::DynamicObject(&this->super_DynamicObject,&type->super_DynamicType,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01dd23c8;
  this->initialized = true;
  SlotInfo::SlotInfo((SlotInfo *)&(this->u).slot);
  if (inlineSlotSize == 0) {
    this->slotType = External;
    Memory::WriteBarrierPtr<void>::operator=(&(this->u).slot,data);
  }
  else {
    this->slotType = Inline;
    (this->u).inlineSlotSize = inlineSlotSize;
    if (data != (void *)0x0) {
      dst = GetInlineSlots(this);
      memcpy_s(dst,(ulong)inlineSlotSize,data,(ulong)inlineSlotSize);
    }
  }
  return;
}

Assistant:

JsrtExternalObject::JsrtExternalObject(JsrtExternalType * type, void *data, uint inlineSlotSize) :
    Js::DynamicObject(type, true /* initSlots*/)
{
    if (inlineSlotSize != 0)
    {
        this->slotType = SlotType::Inline;
        this->u.inlineSlotSize = inlineSlotSize;
        if (data)
        {
            memcpy_s(this->GetInlineSlots(), inlineSlotSize, data, inlineSlotSize);
        }
    }
    else
    {
        this->slotType = SlotType::External;
        this->u.slot = data;
    }
}